

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageLiteGenerator IStack_98;
  
  lVar2 = 0;
  for (lVar3 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar3 < *(int *)(pDVar1 + 0x70); lVar3 = lVar3 + 1) {
    ImmutableMessageLiteGenerator
              (&IStack_98,(Descriptor *)(*(long *)(pDVar1 + 0x38) + lVar2),this->context_);
    GenerateStaticVariableInitializers(&IStack_98,printer);
    ~ImmutableMessageLiteGenerator(&IStack_98);
    lVar2 = lVar2 + 0x88;
  }
  return 0;
}

Assistant:

int ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    bytecode_estimate +=
        ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
            .GenerateStaticVariableInitializers(printer);
  }
  return bytecode_estimate;
}